

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O2

void __thiscall Fl_Shared_Image::reload(Fl_Shared_Image *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Fl_Image *this_00;
  undefined4 extraout_var;
  long lVar4;
  uchar header [64];
  
  if (this->name_ == (char *)0x0) {
    return;
  }
  __stream = (FILE *)fl_fopen(this->name_,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fread(header,1,0x40,__stream);
  fclose(__stream);
  iVar3 = bcmp(header,"#define",7);
  if (iVar3 == 0) {
    this_00 = (Fl_Image *)operator_new(0x38);
    Fl_XBM_Image::Fl_XBM_Image((Fl_XBM_Image *)this_00,this->name_);
  }
  else {
    iVar3 = bcmp(header,"/* XPM */",9);
    if (iVar3 == 0) {
      this_00 = (Fl_Image *)operator_new(0x38);
      Fl_XPM_Image::Fl_XPM_Image((Fl_XPM_Image *)this_00,this->name_);
    }
    else {
      lVar4 = 0;
      do {
        if (num_handlers_ <= lVar4) {
          return;
        }
        this_00 = (*handlers_[lVar4])(this->name_,header,0x40);
        lVar4 = lVar4 + 1;
      } while (this_00 == (Fl_Image *)0x0);
    }
  }
  if ((this->alloc_image_ != 0) && (this->image_ != (Fl_Image *)0x0)) {
    (*this->image_->_vptr_Fl_Image[1])();
  }
  this->alloc_image_ = 1;
  uVar1 = (this->super_Fl_Image).w_;
  if (uVar1 == 0 || this_00->w_ == uVar1) {
    uVar2 = (this->super_Fl_Image).h_;
    if (uVar2 == 0 || this_00->h_ == uVar2) goto LAB_001c5ebf;
  }
  else {
    uVar2 = (this->super_Fl_Image).h_;
  }
  iVar3 = (*this_00->_vptr_Fl_Image[2])(this_00,(ulong)uVar1,(ulong)uVar2);
  (*this_00->_vptr_Fl_Image[1])(this_00);
  this_00 = (Fl_Image *)CONCAT44(extraout_var,iVar3);
LAB_001c5ebf:
  this->image_ = this_00;
  update(this);
  return;
}

Assistant:

void Fl_Shared_Image::reload() {
  // Load image from disk...
  int		i;		// Looping var
  FILE		*fp;		// File pointer
  uchar		header[64];	// Buffer for auto-detecting files
  Fl_Image	*img;		// New image

  if (!name_) return;

  if ((fp = fl_fopen(name_, "rb")) != NULL) {
    if (fread(header, 1, sizeof(header), fp)==0) { /* ignore */ }
    fclose(fp);
  } else {
    return;
  }

  // Load the image as appropriate...
  if (memcmp(header, "#define", 7) == 0) // XBM file
    img = new Fl_XBM_Image(name_);
  else if (memcmp(header, "/* XPM */", 9) == 0) // XPM file
    img = new Fl_XPM_Image(name_);
  else {
    // Not a standard format; try an image handler...
    for (i = 0, img = 0; i < num_handlers_; i ++) {
      img = (handlers_[i])(name_, header, sizeof(header));

      if (img) break;
    }
  }

  if (img) {
    if (alloc_image_) delete image_;

    alloc_image_ = 1;

    if ((img->w() != w() && w()) || (img->h() != h() && h())) {
      // Make sure the reloaded image is the same size as the existing one.
      Fl_Image *temp = img->copy(w(), h());
      delete img;
      image_ = temp;
    } else {
      image_ = img;
    }

    update();
  }
}